

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_pool_2d_back(ggml_compute_params *params,ggml_tensor *dst)

{
  short *psVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ggml_tensor *pgVar10;
  long lVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  size_t __n;
  long lVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  undefined8 uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  float *pfVar28;
  void *__s;
  void *pvVar29;
  float *pfVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  void *local_a0;
  long local_98;
  void *local_50;
  
  if (params->ith == 0) {
    pgVar10 = dst->src[0];
    iVar3 = dst->op_params[3];
    iVar4 = dst->op_params[5];
    iVar5 = dst->op_params[6];
    uVar6 = dst->op_params[0];
    uVar7 = dst->op_params[1];
    uVar8 = dst->op_params[2];
    iVar9 = dst->op_params[4];
    __s = dst->data;
    local_50 = dst->src[1]->data;
    lVar15 = ggml_nbytes(dst);
    if (params->ith != 0) {
      pcVar18 = "params->ith == 0";
      uVar22 = 0x190c;
LAB_00142bb7:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,uVar22,"GGML_ASSERT(%s) failed",pcVar18);
    }
    __n = ggml_nbytes(dst);
    memset(__s,0,__n);
    if (0 < lVar15) {
      pvVar29 = (void *)(lVar15 + (long)__s);
      lVar15 = pgVar10->ne[0];
      lVar11 = pgVar10->ne[1];
      local_a0 = pgVar10->data;
      do {
        if (0 < lVar11) {
          local_98 = 0;
          iVar14 = -iVar5;
          do {
            if (0 < lVar15) {
              if (1 < uVar6) {
                pcVar18 = "false";
                uVar22 = 0x195f;
                goto LAB_00142bb7;
              }
              lVar17 = 0;
              iVar13 = iVar9 * (int)local_98 - iVar5;
              iVar20 = -iVar4;
              do {
                lVar21 = (long)iVar20;
                fVar31 = *(float *)((long)local_a0 + lVar17 * 4 + local_98 * lVar15 * 4);
                if (uVar6 == 0) {
                  if (0 < (int)uVar8) {
                    uVar25 = 0;
                    auVar34 = ZEXT1664(SUB6416(ZEXT464(0xff7fffff),0));
                    uVar19 = 0xffffffff;
                    uVar26 = 0xffffffff;
                    lVar16 = (long)iVar14;
                    do {
                      lVar23 = uVar25 + (long)iVar13;
                      if (((-1 < lVar23) && (lVar23 < dst->ne[1])) && (0 < (int)uVar7)) {
                        lVar23 = dst->nb[1] * lVar16;
                        pfVar30 = (float *)((long)local_50 + lVar23 + lVar21 * 4);
                        uVar27 = 0;
                        do {
                          if ((-1 < (long)(lVar21 + uVar27)) &&
                             ((long)(lVar21 + uVar27) < dst->ne[0])) {
                            pfVar28 = pfVar30;
                            if (dst->type != GGML_TYPE_F32) {
                              pfVar28 = (float *)(&ggml_table_f32_f16 +
                                                 (ulong)*(ushort *)
                                                         ((long)local_50 +
                                                         uVar27 * 2 + lVar23 + lVar21 * 2) * 4);
                            }
                            fVar2 = *pfVar28;
                            fVar32 = auVar34._0_4_;
                            uVar22 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar34._0_16_,6);
                            bVar12 = (bool)((byte)uVar22 & 1);
                            auVar34 = ZEXT1664(CONCAT124(auVar34._4_12_,
                                                         (uint)bVar12 * (int)fVar2 +
                                                         (uint)!bVar12 * (int)fVar32));
                            if (fVar32 < fVar2) {
                              uVar19 = uVar25 & 0xffffffff;
                              uVar26 = uVar27 & 0xffffffff;
                            }
                          }
                          uVar27 = uVar27 + 1;
                          pfVar30 = pfVar30 + 1;
                        } while (uVar7 != uVar27);
                      }
                      uVar25 = uVar25 + 1;
                      lVar16 = lVar16 + 1;
                    } while (uVar25 != uVar8);
                    if (((int)uVar26 != -1) && ((int)uVar19 != -1)) {
                      lVar21 = (long)((int)uVar19 + iVar13) * dst->nb[1];
                      lVar16 = (long)((int)uVar26 + (iVar3 * (int)lVar17 - iVar4));
                      if (dst->type == GGML_TYPE_F32) {
                        *(float *)((long)__s + lVar16 * 4 + lVar21) =
                             fVar31 + *(float *)((long)__s + lVar16 * 4 + lVar21);
                      }
                      else {
                        auVar33 = vcvtps2ph_f16c(ZEXT416((uint)(fVar31 + *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)__s + lVar16 * 2 + lVar21) * 4))),0
                                                );
                        vpextrw_avx(auVar33,0);
                      }
                    }
                  }
                }
                else if (0 < (int)uVar8) {
                  fVar31 = fVar31 / (float)(int)(uVar8 * uVar7);
                  uVar19 = 0;
                  auVar33._4_8_ = SUB128(ZEXT812(0),4);
                  auVar33._0_4_ = fVar31;
                  auVar33._12_4_ = 0;
                  auVar33 = vcvtps2ph_f16c(auVar33,0);
                  lVar16 = (long)iVar14;
                  do {
                    lVar23 = uVar19 + (long)iVar13;
                    if (((-1 < lVar23) && (lVar23 < dst->ne[1])) && (0 < (int)uVar7)) {
                      lVar24 = dst->nb[1] * lVar16;
                      uVar26 = (ulong)uVar7;
                      lVar23 = lVar21;
                      do {
                        if ((-1 < lVar23) && (lVar23 < dst->ne[0])) {
                          if (dst->type == GGML_TYPE_F32) {
                            *(float *)((long)__s + lVar23 * 4 + lVar24) =
                                 fVar31 + *(float *)((long)__s + lVar23 * 4 + lVar24);
                          }
                          else {
                            psVar1 = (short *)((long)__s + lVar23 * 2 + lVar24);
                            *psVar1 = *psVar1 + auVar33._0_2_;
                          }
                        }
                        lVar23 = lVar23 + 1;
                        uVar26 = uVar26 - 1;
                      } while (uVar26 != 0);
                    }
                    uVar19 = uVar19 + 1;
                    lVar16 = lVar16 + 1;
                  } while (uVar19 != uVar8);
                }
                iVar20 = iVar20 + iVar3;
                lVar17 = lVar17 + 1;
              } while (lVar17 != lVar15);
            }
            local_98 = local_98 + 1;
            iVar14 = iVar9 + iVar14;
          } while (local_98 != lVar11);
        }
        __s = (void *)((long)__s + dst->nb[2]);
        local_50 = (void *)((long)local_50 + dst->nb[2]);
        local_a0 = (void *)((long)local_a0 + lVar11 * lVar15 * 4);
      } while (__s < pvVar29);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_pool_2d_back(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src  = dst->src[0];
    const ggml_tensor * dstf = dst->src[1]; // forward tensor of dst

    assert(dst->type == GGML_TYPE_F32 || dst->type == GGML_TYPE_F16);

    if (params->ith != 0) {
        return;
    }

    const int32_t * opts = (const int32_t *)dst->op_params;
    ggml_op_pool op = static_cast<ggml_op_pool>(opts[0]);
    const int k0 = opts[1];
    const int k1 = opts[2];
    const int s0 = opts[3];
    const int s1 = opts[4];
    const int p0 = opts[5];
    const int p1 = opts[6];

    char       * cdata  = (char       *) dst->data;
    const char * cdataf = (const char *) dstf->data;
    const char * const data_end = cdata + ggml_nbytes(dst);

    GGML_ASSERT(params->ith == 0);
    memset(cdata, 0, ggml_nbytes(dst));

    const int64_t px = src->ne[0];
    const int64_t py = src->ne[1];
    const int64_t pa = px * py;

    const float * splane = (const float *) src->data;

    const int ka = k0 * k1;
    const int offset0 = -p0;
    const int offset1 = -p1;

    while (cdata < data_end) {
        for (int oy = 0; oy < py; ++oy) {
            const float * const srow = splane + oy * px;
            for (int ox = 0; ox < px; ++ox) {
                const float grad0 = srow[ox];

                const int ix = offset0 + ox * s0;
                const int iy = offset1 + oy * s1;

                if (op == GGML_OP_POOL_MAX) {
                    float maxval = -FLT_MAX;
                    int kxmax = -1;
                    int kymax = -1;

                    for (int ky = 0; ky < k1; ++ky) {
                        if (iy + ky < 0 || iy + ky >= dst->ne[1]) {
                            continue;
                        }
                        const void * drowf = (const void *)(cdataf + dst->nb[1] * (iy + ky));
                        for (int kx = 0; kx < k0; ++kx) {
                            int j = ix + kx;
                            if (j < 0 || j >= dst->ne[0]) {
                                continue;
                            }

                            const float val = dst->type == GGML_TYPE_F32 ?
                                ((const float *) drowf)[j] : GGML_FP16_TO_FP32(((const ggml_fp16_t *) drowf)[j]);
                            if (val <= maxval) {
                                continue;
                            }

                            maxval = val;
                            kxmax = kx;
                            kymax = ky;
                        }
                    }

                    if (kxmax == -1 || kymax == -1) {
                        continue;
                    }

                    void * drow = (void *)(cdata + dst->nb[1] * (iy + kymax));
                    const int j = ix + kxmax;
                    if (dst->type == GGML_TYPE_F32) {
                        ((float *) drow)[j] += grad0;
                    } else {
                        ((ggml_fp16_t *) drow)[j] = GGML_FP32_TO_FP16(grad0 + GGML_FP16_TO_FP32(((const ggml_fp16_t *) drow)[j]));
                    }
                } else if (op == GGML_OP_POOL_AVG) {
                    const float grad = grad0 / ka;

                    for (int ky = 0; ky < k1; ++ky) {
                        if (iy + ky < 0 || iy + ky >= dst->ne[1]) {
                            continue;
                        }
                        void * drow = (void *)(cdata + dst->nb[1] * (iy + ky));
                        for (int kx = 0; kx < k0; ++kx) {
                            int j = ix + kx;
                            if (j < 0 || j >= dst->ne[0]) {
                                continue;
                            }

                            if (dst->type == GGML_TYPE_F32) {
                                ((float *) drow)[j] += grad;
                            } else {
                                ((ggml_fp16_t *) drow)[j] += GGML_FP32_TO_FP16(grad);
                            }
                        }
                    }
                } else {
                    GGML_ASSERT(false);
                }
            }
        }

        cdata  += dst->nb[2];
        cdataf += dst->nb[2];
        splane += pa;
    }
}